

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_38(QPDF *pdf,char *arg2)

{
  int iVar1;
  int iVar2;
  ostream *this;
  QPDFObjectHandle local_a0;
  string local_90 [32];
  int local_70;
  int i;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle qtest;
  char *arg2_local;
  QPDF *pdf_local;
  
  qtest.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QTest",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  local_70 = 0;
  while( true ) {
    iVar1 = local_70;
    iVar2 = QPDFObjectHandle::getArrayNItems();
    if (iVar2 <= iVar1) break;
    QPDFObjectHandle::getArrayItem((int)&local_a0);
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    this = std::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
    local_70 = local_70 + 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_38(QPDF& pdf, char const* arg2)
{
    // Designed for override-compressed-object.pdf
    QPDFObjectHandle qtest = pdf.getRoot().getKey("/QTest");
    for (int i = 0; i < qtest.getArrayNItems(); ++i) {
        std::cout << qtest.getArrayItem(i).unparseResolved() << std::endl;
    }
}